

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O0

void __thiscall
Potassco::StringBuilder::StringBuilder(StringBuilder *this,char *buf,size_t n,Mode m)

{
  uint8_t t;
  int in_ECX;
  long in_RDX;
  char *in_RSI;
  StringBuilder *in_RDI;
  long local_18;
  char *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_RDX == 0) {
    local_10 = (in_RDI->field_0).sbo_ + 0x3d;
    local_18 = 1;
  }
  (in_RDI->field_0).buf_.head = local_10;
  *local_10 = '\0';
  (in_RDI->field_0).buf_.used = 0;
  (in_RDI->field_0).buf_.size = local_18 - 1;
  t = 0x81;
  if (in_ECX == 0) {
    t = 0x80;
  }
  setTag(in_RDI,t);
  return;
}

Assistant:

StringBuilder::StringBuilder(char* buf, std::size_t n, Mode m) {
	if (!n) { buf = sbo_ + (SboCap - 2); n = 1; }
	*(buf_.head = buf) = 0;
	buf_.used = 0;
	buf_.size = n - 1;
	setTag(m == Fixed ? Buf : Buf|Own);
}